

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O1

void opengv::relative_pose::modules::ge::getEV
               (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
               Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
               Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
               Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
               Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
               Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley,Vector4d *roots)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  Matrix4d G;
  double local_108;
  Matrix4d local_100;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  composeG(&local_100,xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0];
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [4];
  dVar12 = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[4] *
           local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[4];
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [8];
  dVar1 = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[8] *
          local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[8];
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  auVar2 = vmulsd_avx512f(auVar44,auVar44);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [9];
  dVar10 = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[9] *
           local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[9];
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  dVar30 = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd] *
           local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xf];
  auVar3 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar4 = vxorpd_avx512vl(auVar17,auVar3);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [10];
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [5];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (auVar4._0_8_ -
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [10]) - local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[5];
  auVar5 = vsubsd_avx512f(auVar28,auVar13);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0xe] *
                 local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0xe];
  auVar4 = vfmsub213sd_fma(auVar17,auVar27,auVar7);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (auVar4._0_8_ - dVar30) - dVar10;
  auVar4 = vfmadd231sd_fma(auVar9,auVar38,auVar17);
  auVar4 = vfmadd231sd_fma(auVar4,auVar38,auVar27);
  auVar4 = vsubsd_avx512f(auVar4,auVar2);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = (auVar4._0_8_ - dVar1) - dVar12;
  auVar4 = vfmadd231sd_fma(auVar29,auVar13,auVar17);
  auVar4 = vfmadd231sd_fma(auVar4,auVar13,auVar27);
  auVar28 = vfmadd231sd_fma(auVar4,auVar13,auVar38);
  auVar4 = vmulsd_avx512f(auVar31,ZEXT816(0xc000000000000000));
  auVar4 = vmulsd_avx512f(auVar4,auVar34);
  auVar4 = vmulsd_avx512f(auVar4,auVar35);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar30;
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar39,auVar27);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar10;
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar20,auVar17);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar38,auVar7);
  auVar6 = vmulsd_avx512f(auVar27,auVar38);
  auVar4 = vfnmadd213sd_avx512f(auVar6,auVar17,auVar4);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar2,auVar27);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar2,auVar38);
  auVar6 = vmulsd_avx512f(auVar41,ZEXT816(0xc000000000000000));
  auVar6 = vmulsd_avx512f(auVar6,auVar44);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar6,auVar35);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar1;
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar46,auVar17);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar46,auVar38);
  auVar7 = vmulsd_avx512f(auVar43,ZEXT816(0xc000000000000000));
  auVar8 = vmulsd_avx512f(auVar7,auVar44);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar8,auVar34);
  auVar7 = vmulsd_avx512f(auVar7,auVar41);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar7,auVar31);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar12;
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar36,auVar17);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar36,auVar27);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe] * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0xe];
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar13,auVar25);
  auVar3 = vxorpd_avx512vl(auVar13,auVar3);
  auVar9 = vmulsd_avx512f(auVar27,auVar13);
  auVar4 = vfnmadd213sd_avx512f(auVar9,auVar17,auVar4);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar13,auVar39);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar13,auVar20);
  auVar3 = vmulsd_avx512f(auVar38,auVar3);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar3,auVar17);
  auVar9 = vfmadd231sd_avx512f(auVar4,auVar3,auVar27);
  auVar4 = vmulsd_avx512f(auVar38,auVar2);
  auVar4 = vmulsd_avx512f(auVar27,auVar4);
  auVar4 = vfmsub231sd_avx512f(auVar4,auVar20,auVar2);
  auVar2 = vmulsd_avx512f(auVar6,auVar31);
  auVar4 = vfmadd213sd_avx512f(auVar2,auVar34,auVar4);
  auVar2 = vaddsd_avx512f(auVar41,auVar41);
  auVar2 = vmulsd_avx512f(auVar2,auVar44);
  auVar2 = vmulsd_avx512f(auVar2,auVar38);
  auVar4 = vfmadd213sd_avx512f(auVar2,auVar35,auVar4);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar46,auVar39);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [5] * dVar1;
  auVar4 = vfnmadd213sd_avx512f(auVar47,auVar17,auVar4);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] +
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [4]) * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[0xc] *
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  auVar4 = vfmadd213sd_fma(auVar45,auVar27,auVar4);
  auVar2 = vmulsd_avx512f(auVar8,auVar31);
  auVar4 = vfmadd213sd_fma(auVar2,auVar35,auVar4);
  auVar2 = vmulsd_avx512f(auVar7,auVar34);
  auVar4 = vfmadd213sd_fma(auVar2,auVar35,auVar4);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] +
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [4]) * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
              m_data.array[8] *
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [9];
  auVar4 = vfmadd213sd_fma(auVar42,auVar17,auVar4);
  auVar4 = vfmadd231sd_fma(auVar4,auVar36,auVar25);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       dVar12 * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[10];
  auVar4 = vfnmadd213sd_fma(auVar37,auVar17,auVar4);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       dVar30 * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0];
  auVar4 = vfnmadd213sd_fma(auVar40,auVar27,auVar4);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd] * (local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0] +
               local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[0]) *
               local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[9];
  auVar4 = vfmadd213sd_fma(auVar32,auVar35,auVar4);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar10 * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0];
  auVar4 = vfnmadd213sd_fma(auVar6,auVar17,auVar4);
  auVar4 = vfmadd231sd_avx512f(auVar4,auVar3,auVar25);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[10] *
                 local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[5] *
                 local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0];
  auVar4 = vfmadd213sd_fma(auVar2,auVar17,auVar4);
  auVar3 = vmulsd_avx512f(auVar5,auVar5);
  auVar6 = vmulsd_avx512f(auVar5,auVar3);
  auVar7 = vmulsd_avx512f(auVar5,auVar6);
  auVar2 = vfmadd213sd_fma(ZEXT816(0xbfd8000000000000),auVar3,auVar28);
  auVar8 = vmulsd_avx512f(auVar5,auVar28);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar6._0_8_ * 0.125 + auVar8._0_8_ * -0.5;
  auVar6 = vaddsd_avx512f(auVar21,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar3._0_8_ * auVar28._0_8_ * 0.0625;
  auVar28 = vfmadd231sd_fma(auVar8,auVar7,ZEXT816(0xbf88000000000000));
  vmovsd_avx512f(auVar5);
  auVar3 = vmulsd_avx512f(auVar5,auVar9);
  dVar12 = auVar4._0_8_ + auVar28._0_8_ + auVar3._0_8_ * -0.25;
  dVar33 = auVar2._0_8_;
  dVar1 = (dVar33 * dVar33) / -12.0 - dVar12;
  dVar30 = auVar6._0_8_;
  dVar10 = pow(dVar1,3.0);
  auVar4._0_8_ = dVar10 / -27.0;
  auVar15._0_8_ = pow(auVar4._0_8_,0.3333333333333333);
  auVar15._8_56_ = extraout_var;
  if (auVar15._0_8_ < 0.0) {
    dVar10 = sqrt(auVar15._0_8_);
  }
  else {
    auVar2 = vsqrtsd_avx(auVar15._0_16_,auVar15._0_16_);
    dVar10 = auVar2._0_8_;
  }
  auVar4._8_8_ = 0;
  if (auVar4._0_8_ < 0.0) {
    dVar11 = sqrt(auVar4._0_8_);
  }
  else {
    auVar4 = vsqrtsd_avx(auVar4,auVar4);
    dVar11 = auVar4._0_8_;
  }
  dVar12 = acos(((((dVar33 * dVar12) / 3.0 + (dVar33 * dVar33 * dVar33) / -108.0) -
                 dVar30 * dVar30 * 0.125) * -0.5) / dVar11);
  dVar12 = cos(dVar12 * 0.3333333333333333);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar12 * dVar10;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1 * 0.3333333333333333;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = auVar15._0_8_ * dVar12 * dVar10;
  auVar4 = vfmsub231sd_fma(auVar22,auVar3,auVar5);
  auVar23._0_8_ = auVar4._0_8_ / auVar15._0_8_;
  auVar23._8_8_ = auVar4._8_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar33;
  auVar2 = vfmsub231sd_fma(auVar23,auVar18,ZEXT816(0xbfeaaaaaaaaaaaab));
  auVar4 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar2,auVar18);
  if (auVar4._0_8_ < 0.0) {
    auVar16._0_8_ = sqrt(auVar4._0_8_);
    auVar16._8_56_ = extraout_var_00;
    auVar4 = auVar16._0_16_;
  }
  else {
    auVar4 = vsqrtsd_avx(auVar4,auVar4);
  }
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_108 * -0.25;
  auVar28 = vfmadd231sd_fma(auVar26,auVar4,ZEXT816(0xbfe0000000000000));
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar33;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar2._0_8_ * -2.0;
  auVar2 = vfmadd231sd_fma(auVar19,auVar24,ZEXT816(0xc008000000000000));
  dVar12 = (dVar30 + dVar30) / auVar4._0_8_ + auVar2._0_8_;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar12;
    auVar4 = vsqrtsd_avx(auVar14,auVar14);
    dVar12 = auVar4._0_8_;
  }
  (roots->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[2] =
       auVar28._0_8_ + dVar12 * 0.5;
  (roots->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[3] =
       auVar28._0_8_ - dVar12 * 0.5;
  return;
}

Assistant:

void
opengv::relative_pose::modules::ge::getEV(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & cayley,
    Eigen::Vector4d & roots )
{
  Eigen::Matrix4d G = composeG(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley);
  
  // now compute the roots in closed-form
  //double G00_2 = G(0,0) * G(0,0);
  double G01_2 = G(0,1) * G(0,1);
  double G02_2 = G(0,2) * G(0,2);
  double G03_2 = G(0,3) * G(0,3);
  //double G11_2 = G(1,1) * G(1,1);
  double G12_2 = G(1,2) * G(1,2);
  double G13_2 = G(1,3) * G(1,3);
  //double G22_2 = G(2,2) * G(2,2);
  double G23_2 = G(2,3) * G(2,3);
  //double G33_2 = G(3,3) * G(3,3);
  
  double B = -G(3,3)-G(2,2)-G(1,1)-G(0,0);
  double C = -G23_2+G(2,2)*G(3,3)-G13_2-G12_2+G(1,1)*G(3,3)+G(1,1)*G(2,2)-G03_2-G02_2-G01_2+G(0,0)*G(3,3)+G(0,0)*G(2,2)+G(0,0)*G(1,1);
  double D = G13_2*G(2,2)-2.0*G(1,2)*G(1,3)*G(2,3)+G12_2*G(3,3)+G(1,1)*G23_2-G(1,1)*G(2,2)*G(3,3)+G03_2*G(2,2)+G03_2*G(1,1)-2.0*G(0,2)*G(0,3)*G(2,3)+G02_2*G(3,3)+G02_2*G(1,1)-2.0*G(0,1)*G(0,3)*G(1,3)-2.0*G(0,1)*G(0,2)*G(1,2)+G01_2*G(3,3)+G01_2*G(2,2)+G(0,0)*G23_2-G(0,0)*G(2,2)*G(3,3)+G(0,0)*G13_2+G(0,0)*G12_2-G(0,0)*G(1,1)*G(3,3)-G(0,0)*G(1,1)*G(2,2);
  double E = G03_2*G12_2-G03_2*G(1,1)*G(2,2)-2.0*G(0,2)*G(0,3)*G(1,2)*G(1,3)+2.0*G(0,2)*G(0,3)*G(1,1)*G(2,3)+G02_2*G13_2-G02_2*G(1,1)*G(3,3)+2.0*G(0,1)*G(0,3)*G(1,3)*G(2,2)-2.0*G(0,1)*G(0,3)*G(1,2)*G(2,3)-2.0*G(0,1)*G(0,2)*G(1,3)*G(2,3)+2.0*G(0,1)*G(0,2)*G(1,2)*G(3,3)+G01_2*G23_2-G01_2*G(2,2)*G(3,3)-G(0,0)*G13_2*G(2,2)+2.0*G(0,0)*G(1,2)*G(1,3)*G(2,3)-G(0,0)*G12_2*G(3,3)-G(0,0)*G(1,1)*G23_2+G(0,0)*G(1,1)*G(2,2)*G(3,3);

  double B_pw2 = B*B;
  double B_pw3 = B_pw2*B;
  double B_pw4 = B_pw3*B;
  double alpha = -0.375*B_pw2+C;
  double beta = B_pw3/8.0-B*C/2.0+D;
  double gamma = -0.01171875*B_pw4+B_pw2*C/16.0-B*D/4.0+E;
  double alpha_pw2 = alpha*alpha;
  double alpha_pw3 = alpha_pw2*alpha;
  double p = -alpha_pw2/12.0-gamma;
  double q = -alpha_pw3/108.0+alpha*gamma/3.0-pow(beta,2.0)/8.0;
  double helper1 = -pow(p,3.0)/27.0;
  double theta2 = pow( helper1, (1.0/3.0) );
  double theta1 = sqrt(theta2) * cos( (1.0/3.0) * acos( (-q/2.0) / sqrt(helper1) ) );
  double y = -(5.0/6.0)*alpha - ( (1.0/3.0) * p * theta1 - theta1 * theta2) / theta2;
  double w = sqrt(alpha+2.0*y);
  
  //we currently disable the computation of all other roots, they are not used
  //roots[0] = -B/4.0 + 0.5*w + 0.5*sqrt(-3.0*alpha-2.0*y-2.0*beta/w);
  //roots[1] = -B/4.0 + 0.5*w - 0.5*sqrt(-3.0*alpha-2.0*y-2.0*beta/w);
  double temp1 = -B/4.0 - 0.5*w;
  double temp2 = 0.5*sqrt(-3.0*alpha-2.0*y+2.0*beta/w);
  //roots[2] = -B/4.0 - 0.5*w + 0.5*sqrt(-3.0*alpha-2.0*y+2.0*beta/w);
  //roots[3] = -B/4.0 - 0.5*w - 0.5*sqrt(-3.0*alpha-2.0*y+2.0*beta/w); //this is the smallest one!
  roots[2] = temp1 + temp2;
  roots[3] = temp1 - temp2;
}